

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcprepct.c
# Opt level: O3

void pre_process_data(j_compress_ptr cinfo,JSAMPARRAY input_buf,JDIMENSION *in_row_ctr,
                     JDIMENSION in_rows_avail,JSAMPIMAGE output_buf,JDIMENSION *out_row_group_ctr,
                     JDIMENSION out_row_groups_avail)

{
  jpeg_c_prep_controller *pjVar1;
  JDIMENSION JVar2;
  jpeg_c_prep_controller *pjVar3;
  JSAMPARRAY ppJVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  jpeg_component_info *pjVar9;
  int row;
  int iVar10;
  int row_1;
  long lVar11;
  
  uVar5 = *in_row_ctr;
  if (uVar5 < in_rows_avail) {
    pjVar3 = cinfo->prep;
    do {
      if (out_row_groups_avail <= *out_row_group_ctr) {
        return;
      }
      JVar2 = *(JDIMENSION *)((long)&pjVar3[6].start_pass + 4);
      uVar8 = cinfo->max_v_samp_factor - JVar2;
      if (in_rows_avail - uVar5 <= uVar8) {
        uVar8 = in_rows_avail - uVar5;
      }
      (*cinfo->cconvert->color_convert)
                (cinfo,input_buf + uVar5,(JSAMPIMAGE)(pjVar3 + 1),JVar2,uVar8);
      *in_row_ctr = *in_row_ctr + uVar8;
      iVar6 = *(int *)((long)&pjVar3[6].start_pass + 4) + uVar8;
      *(int *)((long)&pjVar3[6].start_pass + 4) = iVar6;
      pjVar1 = pjVar3 + 6;
      *(uint *)&pjVar1->start_pass = *(int *)&pjVar1->start_pass - uVar8;
      iVar7 = cinfo->max_v_samp_factor;
      if (iVar6 < iVar7 && *(int *)&pjVar1->start_pass == 0) {
        iVar6 = cinfo->num_components;
        if (0 < iVar6) {
          lVar11 = 0;
          do {
            iVar7 = cinfo->max_v_samp_factor;
            iVar10 = *(int *)((long)&pjVar3[6].start_pass + 4);
            if (iVar10 < iVar7) {
              ppJVar4 = (JSAMPARRAY)(&pjVar3[1].start_pass)[lVar11];
              JVar2 = cinfo->image_width;
              iVar6 = iVar10 + -1;
              do {
                jcopy_sample_rows(ppJVar4,iVar6,ppJVar4,iVar10,1,JVar2);
                iVar10 = iVar10 + 1;
              } while (iVar7 != iVar10);
              iVar6 = cinfo->num_components;
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 < iVar6);
          iVar7 = cinfo->max_v_samp_factor;
        }
        *(int *)((long)&pjVar3[6].start_pass + 4) = iVar7;
LAB_0011af1f:
        (*cinfo->downsample->downsample)
                  (cinfo,(JSAMPIMAGE)(pjVar3 + 1),0,output_buf,*out_row_group_ctr);
        *(undefined4 *)((long)&pjVar3[6].start_pass + 4) = 0;
        *out_row_group_ctr = *out_row_group_ctr + 1;
      }
      else if (iVar6 == iVar7) goto LAB_0011af1f;
      if ((*(int *)&pjVar3[6].start_pass == 0) && (*out_row_group_ctr < out_row_groups_avail)) {
        iVar7 = cinfo->num_components;
        if (0 < iVar7) {
          pjVar9 = cinfo->comp_info;
          lVar11 = 0;
          do {
            iVar6 = pjVar9->v_samp_factor;
            iVar10 = iVar6 * *out_row_group_ctr;
            if (iVar10 < (int)(iVar6 * out_row_groups_avail)) {
              ppJVar4 = output_buf[lVar11];
              JVar2 = pjVar9->width_in_blocks;
              iVar7 = iVar10 + -1;
              iVar6 = iVar6 * (out_row_groups_avail - *out_row_group_ctr);
              do {
                jcopy_sample_rows(ppJVar4,iVar7,ppJVar4,iVar10,1,JVar2 << 3);
                iVar10 = iVar10 + 1;
                iVar6 = iVar6 + -1;
              } while (iVar6 != 0);
              iVar7 = cinfo->num_components;
            }
            lVar11 = lVar11 + 1;
            pjVar9 = pjVar9 + 1;
          } while (lVar11 < iVar7);
        }
        *out_row_group_ctr = out_row_groups_avail;
        return;
      }
      uVar5 = *in_row_ctr;
    } while (uVar5 < in_rows_avail);
  }
  return;
}

Assistant:

METHODDEF(void)
pre_process_data(j_compress_ptr cinfo, JSAMPARRAY input_buf,
                 JDIMENSION *in_row_ctr, JDIMENSION in_rows_avail,
                 JSAMPIMAGE output_buf, JDIMENSION *out_row_group_ctr,
                 JDIMENSION out_row_groups_avail)
{
  my_prep_ptr prep = (my_prep_ptr)cinfo->prep;
  int numrows, ci;
  JDIMENSION inrows;
  jpeg_component_info *compptr;

  while (*in_row_ctr < in_rows_avail &&
         *out_row_group_ctr < out_row_groups_avail) {
    /* Do color conversion to fill the conversion buffer. */
    inrows = in_rows_avail - *in_row_ctr;
    numrows = cinfo->max_v_samp_factor - prep->next_buf_row;
    numrows = (int)MIN((JDIMENSION)numrows, inrows);
    (*cinfo->cconvert->color_convert) (cinfo, input_buf + *in_row_ctr,
                                       prep->color_buf,
                                       (JDIMENSION)prep->next_buf_row,
                                       numrows);
    *in_row_ctr += numrows;
    prep->next_buf_row += numrows;
    prep->rows_to_go -= numrows;
    /* If at bottom of image, pad to fill the conversion buffer. */
    if (prep->rows_to_go == 0 &&
        prep->next_buf_row < cinfo->max_v_samp_factor) {
      for (ci = 0; ci < cinfo->num_components; ci++) {
        expand_bottom_edge(prep->color_buf[ci], cinfo->image_width,
                           prep->next_buf_row, cinfo->max_v_samp_factor);
      }
      prep->next_buf_row = cinfo->max_v_samp_factor;
    }
    /* If we've filled the conversion buffer, empty it. */
    if (prep->next_buf_row == cinfo->max_v_samp_factor) {
      (*cinfo->downsample->downsample) (cinfo,
                                        prep->color_buf, (JDIMENSION)0,
                                        output_buf, *out_row_group_ctr);
      prep->next_buf_row = 0;
      (*out_row_group_ctr)++;
    }
    /* If at bottom of image, pad the output to a full iMCU height.
     * Note we assume the caller is providing a one-iMCU-height output buffer!
     */
    if (prep->rows_to_go == 0 && *out_row_group_ctr < out_row_groups_avail) {
      for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
           ci++, compptr++) {
        expand_bottom_edge(output_buf[ci], compptr->width_in_blocks * DCTSIZE,
                           (int)(*out_row_group_ctr * compptr->v_samp_factor),
                           (int)(out_row_groups_avail * compptr->v_samp_factor));
      }
      *out_row_group_ctr = out_row_groups_avail;
      break;                    /* can exit outer loop without test */
    }
  }
}